

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

bool __thiscall
Lib::
FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
::hasNext(FilteredIterator<Lib::List<Saturation::ExtensionalityClause>::DelIterator,_Saturation::ExtensionalityClauseContainer::ActiveFilterFn,_true>
          *this)

{
  uint *puVar1;
  Clause *pCVar2;
  Literal *pLVar3;
  uint64_t uVar4;
  List<Saturation::ExtensionalityClause> **ppLVar5;
  List<Saturation::ExtensionalityClause> *pLVar6;
  List<Saturation::ExtensionalityClause> **ppLVar7;
  List<Saturation::ExtensionalityClause> **ppLVar8;
  bool bVar9;
  
  bVar9 = true;
  if ((this->_next).super_OptionBase<Saturation::ExtensionalityClause>._isSome == false) {
    ppLVar5 = (this->_inn)._lst;
    pLVar6 = (this->_inn)._cur;
    ppLVar7 = &pLVar6->_tail;
    bVar9 = pLVar6 == (List<Saturation::ExtensionalityClause> *)0x0;
    ppLVar8 = ppLVar7;
    if (bVar9) {
      ppLVar8 = ppLVar5;
    }
    if (*ppLVar8 != (List<Saturation::ExtensionalityClause> *)0x0) {
      do {
        if (!bVar9) {
          (this->_inn)._prev = pLVar6;
          ppLVar5 = ppLVar7;
        }
        pLVar6 = *ppLVar5;
        (this->_inn)._cur = pLVar6;
        pCVar2 = (pLVar6->_head).clause;
        if (((uint)*(ulong *)&pCVar2->field_0x38 & 0xe000000) == 0x2000000) {
          pLVar3 = (pLVar6->_head).literal;
          uVar4 = (pLVar6->_head).sort._content;
          (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.clause =
               pCVar2;
          (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.literal
               = pLVar3;
          (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._elem._elem.init.sort.
          _content = uVar4;
          (this->_next).super_OptionBase<Saturation::ExtensionalityClause>._isSome = true;
          return true;
        }
        *(ulong *)&pCVar2->field_0x38 = *(ulong *)&pCVar2->field_0x38 & 0xffffffffffbfffff;
        puVar1 = &((this->_func)._parent)->_size;
        *puVar1 = *puVar1 - 1;
        List<Saturation::ExtensionalityClause>::DelIterator::del(&this->_inn);
        ppLVar5 = (this->_inn)._lst;
        pLVar6 = (this->_inn)._cur;
        ppLVar7 = &pLVar6->_tail;
        bVar9 = pLVar6 == (List<Saturation::ExtensionalityClause> *)0x0;
        ppLVar8 = ppLVar7;
        if (bVar9) {
          ppLVar8 = ppLVar5;
        }
      } while (*ppLVar8 != (List<Saturation::ExtensionalityClause> *)0x0);
    }
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }